

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O0

void re_fastputc(EditLine *el,wint_t c)

{
  wint_t *pwVar1;
  wint_t **ppwVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t local_28;
  wchar_t lins;
  wchar_t i;
  wchar_t w;
  wint_t *lastline;
  wint_t c_local;
  EditLine *el_local;
  
  lins = wcwidth(c);
  while( true ) {
    bVar3 = false;
    if (L'\x01' < lins) {
      bVar3 = (el->el_terminal).t_size.h < (el->el_cursor).h + lins;
    }
    if (!bVar3) break;
    re_fastputc(el,0x20);
  }
  terminal__putc(el,c);
  pwVar1 = el->el_display[(el->el_cursor).v];
  wVar4 = (el->el_cursor).h;
  (el->el_cursor).h = wVar4 + L'\x01';
  pwVar1[wVar4] = c;
  while (lins = lins + L'\xffffffff', L'\0' < lins) {
    pwVar1 = el->el_display[(el->el_cursor).v];
    wVar4 = (el->el_cursor).h;
    (el->el_cursor).h = wVar4 + L'\x01';
    pwVar1[wVar4] = 0xffffffff;
  }
  if ((el->el_terminal).t_size.h <= (el->el_cursor).h) {
    (el->el_cursor).h = L'\0';
    if ((el->el_cursor).v + L'\x01' < (el->el_terminal).t_size.v) {
      (el->el_cursor).v = (el->el_cursor).v + L'\x01';
      ppwVar2 = el->el_display;
      wVar4 = (el->el_refresh).r_oldcv + L'\x01';
      (el->el_refresh).r_oldcv = wVar4;
      _i = (wchar_t *)ppwVar2[wVar4];
    }
    else {
      wVar4 = (el->el_terminal).t_size.v;
      _i = (wchar_t *)*el->el_display;
      for (local_28 = L'\x01'; local_28 < wVar4; local_28 = local_28 + L'\x01') {
        el->el_display[local_28 + L'\xffffffff'] = el->el_display[local_28];
      }
      el->el_display[local_28 + L'\xffffffff'] = (wint_t *)_i;
    }
    re__copy_and_pad(_i,anon_var_dwarf_1b5e2 + 3,(long)(el->el_terminal).t_size.h);
    if (((el->el_terminal).t_flags & 0x80U) == 0) {
      terminal__putc(el,0xd);
      terminal__putc(el,10);
    }
    else if (((el->el_terminal).t_flags & 0x100U) != 0) {
      terminal__putc(el,0x20);
      terminal__putc(el,8);
    }
  }
  return;
}

Assistant:

static void
re_fastputc(EditLine *el, wint_t c)
{
	wint_t *lastline;
	int w;

	w = wcwidth(c);
	while (w > 1 && el->el_cursor.h + w > el->el_terminal.t_size.h)
	    re_fastputc(el, ' ');

	terminal__putc(el, c);
	el->el_display[el->el_cursor.v][el->el_cursor.h++] = c;
	while (--w > 0)
		el->el_display[el->el_cursor.v][el->el_cursor.h++]
			= MB_FILL_CHAR;

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {
		/* if we must overflow */
		el->el_cursor.h = 0;

		/*
		 * If we would overflow (input is longer than terminal size),
		 * emulate scroll by dropping first line and shuffling the rest.
		 * We do this via pointer shuffling - it's safe in this case
		 * and we avoid memcpy().
		 */
		if (el->el_cursor.v + 1 >= el->el_terminal.t_size.v) {
			int i, lins = el->el_terminal.t_size.v;

			lastline = el->el_display[0];
			for(i = 1; i < lins; i++)
				el->el_display[i - 1] = el->el_display[i];

			el->el_display[i - 1] = lastline;
		} else {
			el->el_cursor.v++;
			lastline = el->el_display[++el->el_refresh.r_oldcv];
		}
		re__copy_and_pad((wchar_t *)lastline, L"",
		    (size_t)el->el_terminal.t_size.h);

		if (EL_HAS_AUTO_MARGINS) {
			if (EL_HAS_MAGIC_MARGINS) {
				terminal__putc(el, ' ');
				terminal__putc(el, '\b');
			}
		} else {
			terminal__putc(el, '\r');
			terminal__putc(el, '\n');
		}
	}
}